

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
ShowModsIRCCommand::trigger
          (ShowModsIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  long lVar1;
  ulong uVar2;
  char cVar3;
  Server *source_00;
  char *pcVar4;
  char *pcVar5;
  PlayerInfo *extraout_RDX;
  bool bVar6;
  Server *this_00;
  char *pcVar7;
  uint uVar8;
  string_view sVar9;
  
  pcVar7 = (char *)nick._M_len;
  pcVar4 = channel._M_str;
  pcVar5 = pcVar4;
  lVar1 = Jupiter::IRC::Client::getChannel(source,channel._M_len,pcVar4,pcVar4,pcVar7,nick._M_str);
  if (lVar1 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    uVar8 = 0;
    bVar6 = false;
    while( true ) {
      RenX::getCore();
      uVar2 = RenX::Core::getServerCount();
      if (uVar2 == uVar8) break;
      uVar2 = RenX::getCore();
      source_00 = (Server *)RenX::Core::getServer(uVar2);
      this_00 = source_00;
      cVar3 = RenX::Server::isLogChanType((int)source_00);
      if (cVar3 != '\0') {
        sVar9._M_str = pcVar7;
        sVar9._M_len = (size_t)pcVar5;
        ModsGameCommand::trigger((ModsGameCommand *)this_00,source_00,extraout_RDX,sVar9);
        bVar6 = true;
      }
      uVar8 = uVar8 + 1;
    }
    if (!bVar6) {
      Jupiter::IRC::Client::sendMessage
                (source,channel._M_len,pcVar4,0x40,
                 "Error: Channel not attached to any connected Renegade X servers.");
      return;
    }
  }
  return;
}

Assistant:

void ShowModsIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		bool sent = false;
		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				ModsGameCommand_instance.trigger(server, nullptr, ""sv);
				sent = true;
			}
		}
		if (sent == false)
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}